

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this,uint64 *value)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar8;
  
  pbVar2 = this->buffer_;
  pbVar3 = this->buffer_end_;
  iVar5 = (int)pbVar2;
  if (((int)pbVar3 - iVar5 < 10) && ((pbVar3 <= pbVar2 || ((char)pbVar3[-1] < '\0')))) {
    lVar12 = 0;
    uVar7 = 0;
    do {
      if (lVar12 == 10) {
        return false;
      }
      while (pbVar2 = this->buffer_, pbVar2 == this->buffer_end_) {
        bVar4 = Refresh(this);
        if (!bVar4) {
          return false;
        }
      }
      bVar1 = *pbVar2;
      uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << ((char)lVar12 * '\a' & 0x3fU);
      this->buffer_ = pbVar2 + 1;
      lVar12 = lVar12 + 1;
    } while ((char)bVar1 < '\0');
    *value = uVar7;
    return true;
  }
  uVar9 = *pbVar2 & 0x7f;
  uVar8 = 0;
  uVar7 = 0;
  if ((char)*pbVar2 < '\0') {
    uVar9 = uVar9 | (pbVar2[1] & 0x7f) << 7;
    if ((char)pbVar2[1] < '\0') {
      uVar9 = uVar9 | (pbVar2[2] & 0x7f) << 0xe;
      if ((char)pbVar2[2] < '\0') {
        uVar9 = uVar9 | (pbVar2[3] & 0x7f) << 0x15;
        if ((char)pbVar2[3] < '\0') {
          uVar10 = pbVar2[4] & 0x7f;
          if ((char)pbVar2[4] < '\0') {
            uVar10 = uVar10 | (pbVar2[5] & 0x7f) << 7;
            if ((char)pbVar2[5] < '\0') {
              uVar10 = uVar10 | (pbVar2[6] & 0x7f) << 0xe;
              if ((char)pbVar2[6] < '\0') {
                uVar10 = uVar10 | (pbVar2[7] & 0x7f) << 0x15;
                if ((char)pbVar2[7] < '\0') {
                  uVar6 = pbVar2[8] & 0x7f;
                  uVar7 = (ulong)uVar6;
                  if ((char)pbVar2[8] < '\0') {
                    if ((char)pbVar2[9] < '\0') {
                      return false;
                    }
                    iVar11 = iVar5 + 10;
                    uVar7 = (ulong)((pbVar2[9] & 0x7f) << 7 | uVar6);
                  }
                  else {
                    iVar11 = iVar5 + 9;
                  }
                }
                else {
                  iVar11 = iVar5 + 8;
                }
              }
              else {
                iVar11 = iVar5 + 7;
              }
            }
            else {
              iVar11 = iVar5 + 6;
              uVar7 = uVar8;
            }
          }
          else {
            iVar11 = iVar5 + 5;
            uVar7 = uVar8;
          }
          goto LAB_001da4fc;
        }
        iVar11 = iVar5 + 4;
      }
      else {
        iVar11 = iVar5 + 3;
      }
    }
    else {
      iVar11 = iVar5 + 2;
    }
  }
  else {
    iVar11 = iVar5 + 1;
  }
  uVar10 = 0;
  uVar7 = uVar8;
LAB_001da4fc:
  this->buffer_ = pbVar2 + (iVar11 - iVar5);
  *value = uVar7 << 0x38 | (ulong)uVar10 << 0x1c | (ulong)uVar9;
  return true;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}